

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

Locale * icu_63::Collator::getAvailableLocales(int32_t *count)

{
  Locale *pLVar1;
  UBool UVar2;
  uint in_EAX;
  Locale *pLVar3;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  *count = 0;
  UVar2 = isAvailableLocaleListInitialized((UErrorCode *)((long)&uStack_18 + 4));
  pLVar1 = ::availableLocaleList;
  pLVar3 = (Locale *)0x0;
  if (UVar2 != '\0') {
    *count = ::availableLocaleListCount;
    pLVar3 = pLVar1;
  }
  return pLVar3;
}

Assistant:

const Locale* U_EXPORT2 Collator::getAvailableLocales(int32_t& count) 
{
    UErrorCode status = U_ZERO_ERROR;
    Locale *result = NULL;
    count = 0;
    if (isAvailableLocaleListInitialized(status))
    {
        result = availableLocaleList;
        count = availableLocaleListCount;
    }
    return result;
}